

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
SolidGlassMaterial::sample
          (SolidGlassMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,
          bool emit)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  result_type rVar1;
  Texture *this_01;
  undefined8 uVar2;
  Vector3f *pVVar3;
  Vector3f *v;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM5 [16];
  Vector3f np;
  Ray ray2;
  undefined1 local_c4 [12];
  undefined1 local_b8 [16];
  undefined8 local_a0;
  Vector3f *local_98;
  float local_8c;
  Vector3f local_88;
  Vector3f local_7c;
  Vector3f local_70;
  undefined4 local_64;
  Vector3f local_60;
  Vector3f local_54;
  Vector2f local_48;
  Vector2f local_40;
  Vector2f local_38;
  undefined1 extraout_var [60];
  
  auVar8 = in_ZMM3._0_16_;
  this_00 = rt->g;
  v = &ray->d;
  local_98 = coe;
  operator-(v);
  local_a0 = &hit->norm;
  auVar9._0_4_ = Vector3f::dot(&local_7c,(Vector3f *)local_a0);
  auVar9._4_60_ = extraout_var;
  auVar7 = auVar9._0_16_;
  auVar4._8_4_ = 0x80000000;
  auVar4._0_8_ = 0x8000000080000000;
  auVar4._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(auVar7,auVar4);
  if (auVar9._0_4_ <= auVar4._0_4_) {
    auVar4 = vfmadd213ss_fma(auVar7,auVar4,ZEXT416(0x3f800000));
    auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,auVar4);
    if (auVar4._0_4_ < 0.0) {
      fVar5 = sqrtf(auVar4._0_4_);
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar5 = auVar4._0_4_;
    }
    fVar6 = fVar5 / this->refractCoef;
    if (fVar6 <= 1.0) {
      local_b8._0_4_ = fVar5;
      local_8c = asinf(fVar5);
      fVar5 = asinf(fVar6);
      Vector3f::Vector3f(&local_7c,0.0);
      Vector3f::Vector3f(&local_70,0.0);
      local_64 = 3.4028235e+38;
      ::operator*((Vector3f *)local_c4,hit->t);
      operator+(&ray->o,(Vector3f *)local_c4);
      Vector3f::operator=(&local_7c,&local_88);
      uVar2 = local_a0;
      if (((float)local_b8._0_4_ != 0.0) || (NAN((float)local_b8._0_4_))) {
        fVar5 = local_8c - fVar5;
        Vector3f::normalized(&local_54);
        fVar5 = sinf(fVar5);
        ::operator*(&local_60,fVar5 / (float)local_b8._0_4_);
        operator+(v,&local_60);
        Vector3f::normalized((Vector3f *)local_c4);
        Vector3f::operator=(&local_70,(Vector3f *)local_c4);
      }
      else {
        Vector3f::operator=(&local_70,v);
        uVar2 = local_a0;
      }
      fVar5 = Vector3f::dot((Vector3f *)uVar2,&local_70);
      fVar5 = 1.0 - fVar5;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar5 * fVar5 * fVar5 * (1.0 - this->r0))),
                               ZEXT416((uint)fVar5),ZEXT416((uint)this->r0));
      auVar7._0_8_ = (double)auVar4._0_4_;
      auVar7._8_8_ = auVar4._8_8_;
      auVar4 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar7,ZEXT816(0x3fd0000000000000));
      local_b8._0_4_ = (float)auVar4._0_8_;
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      auVar4 = vcvtusi2sd_avx512f(auVar8,rVar1);
      if ((float)local_b8._0_4_ < (float)(auVar4._0_8_ / 4294967295.0)) {
        Vector3f::operator=(&ray->o,&local_7c);
        Vector3f::operator=(v,&local_70);
        ray->tmax = (float)local_64;
        Vector2f::Vector2f(&local_40,&hit->pos);
        this_01 = (Texture *)&local_88;
        Texture::get(this_01,(Vector2f *)&this->refractColor);
        pVVar3 = (Vector3f *)local_c4;
        goto LAB_001c03c3;
      }
    }
  }
  else {
    auVar4 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar4,auVar7);
    auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,auVar4);
    if (auVar4._0_4_ < 0.0) {
      local_b8 = auVar7;
      fVar5 = sqrtf(auVar4._0_4_);
      auVar7 = local_b8;
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
      fVar5 = auVar4._0_4_;
    }
    fVar6 = fVar5 * this->refractCoef;
    if (fVar6 <= 1.0) {
      local_b8._0_4_ = fVar5;
      fVar5 = 1.0 - auVar7._0_4_;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar5 * fVar5 * fVar5 * (1.0 - this->r0))),
                               ZEXT416((uint)fVar5),ZEXT416((uint)this->r0));
      auVar8._0_8_ = (double)auVar4._0_4_;
      auVar8._8_8_ = auVar4._8_8_;
      auVar7 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar8,ZEXT816(0x3fd0000000000000));
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      auVar4 = vcvtusi2sd_avx512f(in_XMM5,rVar1);
      if ((float)auVar7._0_8_ < (float)(auVar4._0_8_ / 4294967295.0)) {
        fVar5 = asinf((float)local_b8._0_4_);
        fVar6 = asinf(fVar6);
        ::operator*(&local_7c,hit->t);
        operator+(&ray->o,&local_7c);
        Vector3f::operator=(&ray->o,(Vector3f *)local_c4);
        if (((float)local_b8._0_4_ != 0.0) || (NAN((float)local_b8._0_4_))) {
          Vector3f::normalized(&local_60);
          fVar5 = sinf(fVar5 - fVar6);
          ::operator*(&local_88,fVar5 / (float)local_b8._0_4_);
          operator-(v,&local_88);
          Vector3f::normalized(&local_7c);
          Vector3f::operator=(v,&local_7c);
        }
        Vector2f::Vector2f(&local_38,&hit->pos);
        this_01 = (Texture *)local_c4;
        Texture::get(this_01,(Vector2f *)&this->refractColor);
        pVVar3 = &local_7c;
LAB_001c03c3:
        v = local_98;
        ::operator*(local_98,(Vector3f *)this_01);
        goto LAB_001c03d6;
      }
    }
  }
  Vector2f::Vector2f(&local_48,&hit->pos);
  Texture::get((Texture *)local_c4,(Vector2f *)&this->reflectColor);
  pVVar3 = local_98;
  ::operator*(local_98,(Vector3f *)local_c4);
  Vector3f::operator=(pVVar3,&local_7c);
  uVar2 = local_a0;
  ::operator*(&local_88,2.0);
  operator-(v);
  fVar5 = Vector3f::dot((Vector3f *)uVar2,&local_60);
  ::operator*(&local_7c,fVar5);
  pVVar3 = (Vector3f *)local_c4;
  operator+(&local_7c,v);
  Vector3f::normalize(pVVar3);
  ::operator*(&local_7c,hit->t);
  operator+(&ray->o,&local_7c);
  Vector3f::operator=(&ray->o,&local_88);
LAB_001c03d6:
  Vector3f::operator=(v,pVVar3);
  return true;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override {
		using std::cerr;
		RNG_TYPE& g = *rt.g;
		float co = Vector3f::dot(-ray.d, hit.norm);
//		std::cerr << co << "sample!"<<" "<<hit.norm[0]<<"w"<<hit.norm[1]<<"w"<<hit.norm[2]<<" "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<"\n";
		if (co > 0) { //air->glass
			float si = sqrtf(std::max(1 - co * co, float(0)));
			float si2 = si * refractCoef;
//			cerr << "check A " << si2 << "\n";
			if (si2 <= 1) { //total reflection otherwise
				float u = 1 - co;
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  " << r0 << "\n";
				if (randf(g) > r) //refract
				{
					//get refraction ray as a linear combination
					float beta = asinf(si), alpha = asinf(si2);
					//					std::cerr << "refract A " << si << "->" << si2 << "  "<<beta<<"->"<<alpha<<"\n";
					float s = beta - alpha;
					ray.o = ray.pos(hit.t);
					//					ray.d = -((-ray.d) * s + hit.norm).normalized();
					if (si != 0) //unchanged otherwise
						ray.d = (ray.d - hit.norm.normalized() * (sinf(s) / si)).normalized();
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
		else { //glass->air
			co = -co;
			float si = sqrtf(std::max(1 - co * co,float(0)));
			float si2 = si / refractCoef;
//			cerr << "check B " << si2 << " "<<ray.d[0]<<"w"<<ray.d[1]<<"w"<<ray.d[2]<<" "<<hit.t<<"\n";
//			std::cerr << si << "w" << si2 << "  "<< 1 - co * co <<"?\n";
			if (si2 <= 1) { //total reflection otherwise
					//get refraction ray as a linear combination
				float beta = asinf(si), alpha = asinf(si2);
				//					std::cerr << "refract B " << si << "->" << si2 << "  " << beta << "->" << alpha << "\n";
				float s = beta - alpha;
				Ray ray2;
				ray2.o = ray.pos(hit.t);
				if (si != 0) //unchanged otherwise
					ray2.d = (ray.d + hit.norm.normalized() * (sinf(s) / si)).normalized();
				else ray2.d = ray.d;
				float u = 1 - Vector3f::dot(hit.norm, ray2.d);
//				std::cerr << u << "?\n";
				float r = r0 + (1 - r0) * u * u * u * u * u;
				r = 0.25 + 0.5 * r;
//				cerr << "prob=" << r << "  "<<r0<<"\n";
				if (randf(g) > r) //refract
				{
//					std::cerr << "cool refract!\n";
					ray = ray2;
					coe = coe * refractColor.get(hit.pos);
					return 1;
				}
			}
		}
//		std::cerr << "reflect :(\n";
		//reflect
		coe = coe * reflectColor.get(hit.pos);
		Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
		ray.o = ray.pos(hit.t); ray.d = np; return 1;
		/*
		float co = Vector3f::dot(-ray.d, hit.norm);
		bool in = co > 0; if (!in) co = -co;
		float c = in ? (1 / refractCoef) : refractCoef;
		float cos2t = 1 - c * c * (1 - co * co);
		if (cos2t < 0) //internal
		{
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		Vector3f rp;
		float c = 1 - (in ? co : Vector3f::dot(rp, hit.norm));
		float p = r0 + (1 - r0) * c * c * c * c * c;
		if (randf(g) < p) { //reflect
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		else { //refract
			coe = coe * reflectColor.get(hit.pos);
			Vector3f np = hit.norm * 2 * Vector3f::dot(hit.norm, -ray.d) + ray.d; np.normalize();
			ray.o = ray.pos(hit.t); ray.d = np; return 1;
		}
		bool into = n.dot(nl) > 0;                // Ray from outside going in? 
		double nc = 1, nt = 1.5, nnt = into ? nc / nt : nt / nc, ddn = r.d.dot(nl), cos2t;
		if ((cos2t = 1 - nnt * nnt * (1 - ddn * ddn)) < 0)    // Total internal reflection 
			return obj.e + f.mult(radiance(reflRay, depth, Xi));
		Vec tdir = (r.d * nnt - n * ((into ? 1 : -1) * (ddn * nnt + sqrt(cos2t)))).norm();
		double a = nt - nc, b = nt + nc, R0 = a * a / (b * b), c = 1 - (into ? -ddn : tdir.dot(n));
		double Re = R0 + (1 - R0) * c * c * c * c * c, Tr = 1 - Re, P = .25 + .5 * Re, RP = Re / P, TP = Tr / (1 - P);
		return obj.e + f.mult(depth > 2 ? (erand48(Xi) < P ?   // Russian roulette 
			radiance(reflRay, depth, Xi) * RP : radiance(Ray(x, tdir), depth, Xi) * TP) :
			radiance(reflRay, depth, Xi) * Re + radiance(Ray(x, tdir), depth, Xi) * Tr);*/
	}